

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void save_load(OjaNewton *ON,io_buf *model_file,bool read,bool text)

{
  vw *all;
  ostream *poVar1;
  undefined7 in_register_00000011;
  bool resume;
  stringstream msg;
  ostream local_1a0;
  
  all = ON->all;
  if ((int)CONCAT71(in_register_00000011,read) != 0) {
    initialize_regressor(all);
    OjaNewton::initialize_Z(ON,&all->weights);
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    resume = all->save_resume;
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar1 = std::operator<<(&local_1a0,":");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
    bin_text_read_write_fixed(model_file,&resume,1,"",read,&msg,text);
    if (resume == true) {
      GD::save_load_online_state(all,model_file,read,text,(gd *)0x0);
    }
    else {
      GD::save_load_regressor(all,model_file,read,text);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  return;
}

Assistant:

void save_load(OjaNewton& ON, io_buf& model_file, bool read, bool text)
{
  vw& all = *ON.all;
  if (read)
  {
    initialize_regressor(all);
    ON.initialize_Z(all.weights);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = all.save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);

    if (resume)
      GD::save_load_online_state(all, model_file, read, text);
    else
      GD::save_load_regressor(all, model_file, read, text);
  }
}